

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O3

void add_token(VARR_token_t *to,token_t t)

{
  short sVar1;
  ushort uVar2;
  node_code_t nVar3;
  char *pcVar4;
  node_t_conflict pnVar5;
  token_t *__ptr;
  uint *puVar6;
  node_t_conflict n;
  size_t in_RCX;
  ulong uVar7;
  char *extraout_RDX;
  size_t sVar8;
  pos_t pos;
  
  if ((*(short *)t == 10) || (*(short *)t == 0x20)) {
    if (to != (VARR_token_t *)0x0) {
      in_RCX = to->els_num;
      if (in_RCX == 0) {
        in_RCX = 0;
      }
      else {
        if (to->varr == (token_t *)0x0) goto LAB_0019428b;
        sVar1 = *(short *)to->varr[in_RCX - 1];
        if (sVar1 == 10) {
          return;
        }
        if (sVar1 == 0x20) {
          return;
        }
      }
      goto LAB_00194239;
    }
  }
  else {
    in_RCX = to->els_num;
LAB_00194239:
    __ptr = to->varr;
    if (__ptr != (token_t *)0x0) {
      uVar7 = in_RCX + 1;
      if (to->size < uVar7) {
        sVar8 = (uVar7 >> 1) + uVar7;
        __ptr = (token_t *)realloc(__ptr,sVar8 * 8);
        to->varr = __ptr;
        to->size = sVar8;
        in_RCX = to->els_num;
        uVar7 = in_RCX + 1;
      }
      to->els_num = uVar7;
      __ptr[in_RCX] = t;
      return;
    }
    add_token_cold_3();
  }
  add_token_cold_2();
LAB_0019428b:
  add_token_cold_1();
  pcVar4 = t->repr;
  uVar2 = *(ushort *)t;
  nVar3 = t->node_code;
  puVar6 = (uint *)reg_malloc((c2m_ctx_t)to,0x30);
  *puVar6 = (uint)uVar2;
  *(char **)(puVar6 + 2) = extraout_RDX;
  *(size_t *)(puVar6 + 4) = in_RCX;
  *(char **)(puVar6 + 10) = pcVar4;
  puVar6[6] = nVar3;
  puVar6[8] = 0;
  puVar6[9] = 0;
  pnVar5 = t->node;
  if (pnVar5 != (node_t_conflict)0x0) {
    n = new_node((c2m_ctx_t)to,pnVar5->code);
    pos.lno = (int)in_RCX;
    pos.ln_pos = (int)(in_RCX >> 0x20);
    pos.fname = extraout_RDX;
    set_node_pos((c2m_ctx_t)to,n,pos);
    sVar8 = (pnVar5->u).s.len;
    (n->u).s.s = (pnVar5->u).s.s;
    (n->u).s.len = sVar8;
    *(node_t_conflict *)(puVar6 + 8) = n;
  }
  return;
}

Assistant:

static void add_token (VARR (token_t) * to, token_t t) {
  if ((t->code != ' ' && t->code != '\n') || VARR_LENGTH (token_t, to) == 0
      || (VARR_LAST (token_t, to)->code != ' ' && VARR_LAST (token_t, to)->code != '\n'))
    VARR_PUSH (token_t, to, t);
}